

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::HasBitIndex
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint32 *puVar1;
  bool bVar2;
  char *pcVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __c;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  ReflectionSchema *this_local;
  
  local_18 = field;
  field_local = (FieldDescriptor *)this;
  bVar2 = HasHasbits(this);
  local_51 = 0;
  __c = extraout_EDX;
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.h"
               ,0xa0);
    local_51 = 1;
    field = (FieldDescriptor *)LogMessage::operator<<(&local_50,"CHECK failed: HasHasbits(): ");
    LogFinisher::operator=(local_65,(LogMessage *)field);
    __c = extraout_EDX_00;
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
    __c = extraout_EDX_01;
  }
  puVar1 = this->has_bit_indices_;
  pcVar3 = FieldDescriptor::index(local_18,(char *)field,__c);
  return puVar1[(int)pcVar3];
}

Assistant:

uint32 HasBitIndex(const FieldDescriptor* field) const {
    GOOGLE_DCHECK(HasHasbits());
    return has_bit_indices_[field->index()];
  }